

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exp.h
# Opt level: O2

RegEx * YAML::Exp::DocEnd(void)

{
  int iVar1;
  RegEx *ex1;
  allocator local_89;
  RegEx local_88;
  RegEx local_68;
  string local_48;
  RegEx local_28;
  
  if (DocEnd()::e == '\0') {
    iVar1 = __cxa_guard_acquire(&DocEnd()::e);
    if (iVar1 != 0) {
      std::__cxx11::string::string((string *)&local_48,"...",&local_89);
      RegEx::RegEx(&local_28,&local_48,REGEX_SEQ);
      ex1 = BlankOrBreak();
      RegEx::RegEx(&local_88);
      operator|(&local_68,ex1,&local_88);
      operator+(&DocEnd::e,&local_28,&local_68);
      std::vector<YAML::RegEx,_std::allocator<YAML::RegEx>_>::~vector(&local_68.m_params);
      std::vector<YAML::RegEx,_std::allocator<YAML::RegEx>_>::~vector(&local_88.m_params);
      std::vector<YAML::RegEx,_std::allocator<YAML::RegEx>_>::~vector(&local_28.m_params);
      std::__cxx11::string::~string((string *)&local_48);
      __cxa_atexit(RegEx::~RegEx,&DocEnd::e,&__dso_handle);
      __cxa_guard_release(&DocEnd()::e);
    }
  }
  return &DocEnd::e;
}

Assistant:

inline const RegEx& DocEnd() {
  static const RegEx e = RegEx("...") + (BlankOrBreak() | RegEx());
  return e;
}